

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O1

wasm_globaltype_t * wasm_globaltype_new(wasm_valtype_t *type,wasm_mutability_t mut)

{
  wasm_globaltype_t *local_10;
  
  if (type != (wasm_valtype_t *)0x0) {
    wasm_globaltype_new_cold_1();
    return local_10;
  }
  __assert_fail("type",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/interp/interp-wasm-c-api.cc"
                ,0x335,"wasm_globaltype_t *wasm_globaltype_new(wasm_valtype_t *, wasm_mutability_t)"
               );
}

Assistant:

own wasm_globaltype_t* wasm_globaltype_new(own wasm_valtype_t* type,
                                           wasm_mutability_t mut) {
  assert(type);
  auto* result = new wasm_globaltype_t{GlobalType{
      type->I, mut == WASM_CONST ? Mutability::Const : Mutability::Var}};
  wasm_valtype_delete(type);
  return result;
}